

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

depth_first_traverser * __thiscall
clipp::group::depth_first_traverser::skip_alternatives(depth_first_traverser *this)

{
  bool bVar1;
  reference pcVar2;
  __normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
  _Var3;
  context *c;
  iterator __end2;
  iterator __begin2;
  context_list *__range2;
  depth_first_traverser *this_local;
  
  bVar1 = std::
          vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
          ::empty(&this->stack_);
  if (!bVar1) {
    __end2 = std::
             vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ::begin(&this->stack_);
    c = (context *)
        std::
        vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ::end(&this->stack_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>
                                       *)&c), bVar1) {
      pcVar2 = __gnu_cxx::
               __normal_iterator<clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>
               ::operator*(&__end2);
      if (((pcVar2->parent != (group *)0x0) && (bVar1 = exclusive(pcVar2->parent), bVar1)) &&
         (bVar1 = __gnu_cxx::operator<(&pcVar2->cur,&pcVar2->end), bVar1)) {
        _Var3 = __gnu_cxx::
                __normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
                ::operator+(&pcVar2->cur,1);
        (pcVar2->end)._M_current = _Var3._M_current;
      }
      __gnu_cxx::
      __normal_iterator<clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>
      ::operator++(&__end2);
    }
  }
  return this;
}

Assistant:

depth_first_traverser&
        skip_alternatives() {
            if(stack_.empty()) return *this;

            //exclude all other alternatives in surrounding groups
            //by making their current position the last one
            for(auto& c : stack_) {
                if(c.parent && c.parent->exclusive() && c.cur < c.end)
                    c.end = c.cur+1;
            }

            return *this;
        }